

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

ssh_key * rsa2_new_pub(ssh_keyalg *self,ptrlen data)

{
  _Bool _Var1;
  RSAKey *key;
  mp_int *pmVar2;
  RSAKey *rsa;
  ptrlen pl;
  BinarySource src [1];
  BinarySource local_38;
  
  local_38.len = data.len;
  local_38.data = data.ptr;
  local_38.binarysource_ = &local_38;
  local_38.pos = 0;
  local_38.err = BSE_NO_ERROR;
  pl = BinarySource_get_string(&local_38);
  _Var1 = ptrlen_eq_string(pl,"ssh-rsa");
  if (_Var1) {
    key = (RSAKey *)safemalloc(1,0x48,0);
    (key->sshk).vt = self;
    pmVar2 = BinarySource_get_mp_ssh2(local_38.binarysource_);
    key->exponent = pmVar2;
    pmVar2 = BinarySource_get_mp_ssh2(local_38.binarysource_);
    key->modulus = pmVar2;
    key->private_exponent = (mp_int *)0x0;
    key->p = (mp_int *)0x0;
    key->q = (mp_int *)0x0;
    key->iqmp = (mp_int *)0x0;
    key->comment = (char *)0x0;
    if ((local_38.binarysource_)->err == BSE_NO_ERROR) {
      return &key->sshk;
    }
    freersakey(key);
    safefree(key);
  }
  return (ssh_key *)0x0;
}

Assistant:

static ssh_key *rsa2_new_pub(const ssh_keyalg *self, ptrlen data)
{
    BinarySource src[1];
    RSAKey *rsa;

    BinarySource_BARE_INIT_PL(src, data);
    if (!ptrlen_eq_string(get_string(src), "ssh-rsa"))
        return NULL;

    rsa = snew(RSAKey);
    rsa->sshk.vt = self;
    rsa->exponent = get_mp_ssh2(src);
    rsa->modulus = get_mp_ssh2(src);
    rsa->private_exponent = NULL;
    rsa->p = rsa->q = rsa->iqmp = NULL;
    rsa->comment = NULL;

    if (get_err(src)) {
        rsa2_freekey(&rsa->sshk);
        return NULL;
    }

    return &rsa->sshk;
}